

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void google::protobuf::compiler::js::FindProvidesForOneOfEnums
               (GeneratorOptions *options,Printer *printer,Descriptor *desc,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *provided)

{
  bool bVar1;
  int iVar2;
  OneofDescriptor *pOVar3;
  int local_2c;
  int i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *provided_local;
  Descriptor *desc_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  
  bVar1 = anon_unknown_0::HasOneofFields(desc);
  if (bVar1) {
    for (local_2c = 0; iVar2 = Descriptor::oneof_decl_count(desc), local_2c < iVar2;
        local_2c = local_2c + 1) {
      pOVar3 = Descriptor::oneof_decl(desc,local_2c);
      bVar1 = anon_unknown_0::IgnoreOneof(pOVar3);
      if (!bVar1) {
        pOVar3 = Descriptor::oneof_decl(desc,local_2c);
        FindProvidesForOneOfEnum(options,pOVar3,provided);
      }
    }
  }
  return;
}

Assistant:

void FindProvidesForOneOfEnums(const GeneratorOptions& options,
                               io::Printer* printer, const Descriptor* desc,
                               std::set<std::string>* provided) {
  if (HasOneofFields(desc)) {
    for (int i = 0; i < desc->oneof_decl_count(); i++) {
      if (IgnoreOneof(desc->oneof_decl(i))) {
        continue;
      }
      FindProvidesForOneOfEnum(options, desc->oneof_decl(i), provided);
    }
  }
}